

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O1

FilePath * __thiscall
testing::internal::FilePath::RemoveFileName(FilePath *__return_storage_ptr__,FilePath *this)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *__s;
  char *pcVar3;
  long *local_88 [2];
  long local_78 [2];
  size_type *local_68;
  string dir;
  size_type local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  undefined8 uStack_30;
  
  __s = (this->pathname_)._M_dataplus._M_p;
  pcVar3 = strrchr(__s,0x2f);
  psVar1 = &dir._M_string_length;
  dir._M_dataplus._M_p = (pointer)0x0;
  dir._M_string_length._0_1_ = 0;
  local_68 = psVar1;
  if (pcVar3 == (char *)0x0) {
    std::__cxx11::string::_M_replace((ulong)&local_68,0,(char *)0x0,0x13bc1a);
  }
  else {
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,__s,pcVar3 + 1);
    std::__cxx11::string::operator=((string *)&local_68,(string *)local_88);
    if (local_88[0] != local_78) {
      operator_delete(local_88[0],local_78[0] + 1);
    }
  }
  dir.field_2._8_8_ = &local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&dir.field_2 + 8),local_68,dir._M_dataplus._M_p + (long)local_68);
  paVar2 = &(__return_storage_ptr__->pathname_).field_2;
  (__return_storage_ptr__->pathname_)._M_dataplus._M_p = (pointer)paVar2;
  if ((undefined1 *)dir.field_2._8_8_ == &local_38) {
    paVar2->_M_allocated_capacity = CONCAT71(uStack_37,local_38);
    *(undefined8 *)((long)&(__return_storage_ptr__->pathname_).field_2 + 8) = uStack_30;
  }
  else {
    (__return_storage_ptr__->pathname_)._M_dataplus._M_p = (pointer)dir.field_2._8_8_;
    (__return_storage_ptr__->pathname_).field_2._M_allocated_capacity = CONCAT71(uStack_37,local_38)
    ;
  }
  (__return_storage_ptr__->pathname_)._M_string_length = local_40;
  local_38 = 0;
  dir.field_2._8_8_ = &local_38;
  Normalize(__return_storage_ptr__);
  if ((undefined1 *)dir.field_2._8_8_ != &local_38) {
    operator_delete((void *)dir.field_2._8_8_,CONCAT71(uStack_37,local_38) + 1);
  }
  if (local_68 != psVar1) {
    operator_delete(local_68,CONCAT71(dir._M_string_length._1_7_,(undefined1)dir._M_string_length) +
                             1);
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::RemoveFileName() const {
  const char* const last_sep = FindLastPathSeparator();
  std::string dir;
  if (last_sep) {
    dir = std::string(c_str(), static_cast<size_t>(last_sep + 1 - c_str()));
  } else {
    dir = kCurrentDirectoryString;
  }
  return FilePath(dir);
}